

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O0

Aig_Obj_t * Aig_Miter(Aig_Man_t *p,Vec_Ptr_t *vPairs)

{
  Aig_Obj_t *pAVar1;
  int local_1c;
  int i;
  Vec_Ptr_t *vPairs_local;
  Aig_Man_t *p_local;
  
  if (vPairs->nSize < 1) {
    __assert_fail("vPairs->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigOper.c"
                  ,0x1b2,"Aig_Obj_t *Aig_Miter(Aig_Man_t *, Vec_Ptr_t *)");
  }
  if (vPairs->nSize % 2 == 0) {
    for (local_1c = 0; local_1c < vPairs->nSize; local_1c = local_1c + 2) {
      pAVar1 = Aig_Exor(p,(Aig_Obj_t *)vPairs->pArray[local_1c],
                        (Aig_Obj_t *)vPairs->pArray[local_1c + 1]);
      pAVar1 = Aig_Not(pAVar1);
      vPairs->pArray[local_1c / 2] = pAVar1;
    }
    vPairs->nSize = vPairs->nSize / 2;
    pAVar1 = Aig_Multi_rec(p,(Aig_Obj_t **)vPairs->pArray,vPairs->nSize,AIG_OBJ_AND);
    pAVar1 = Aig_Not(pAVar1);
    return pAVar1;
  }
  __assert_fail("vPairs->nSize % 2 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigOper.c"
                ,0x1b3,"Aig_Obj_t *Aig_Miter(Aig_Man_t *, Vec_Ptr_t *)");
}

Assistant:

Aig_Obj_t * Aig_Miter( Aig_Man_t * p, Vec_Ptr_t * vPairs )
{
    int i;
    assert( vPairs->nSize > 0 );
    assert( vPairs->nSize % 2 == 0 );
    for ( i = 0; i < vPairs->nSize; i += 2 )
        vPairs->pArray[i/2] = Aig_Not( Aig_Exor( p, (Aig_Obj_t *)vPairs->pArray[i], (Aig_Obj_t *)vPairs->pArray[i+1] ) );
    vPairs->nSize = vPairs->nSize/2;
    return Aig_Not( Aig_Multi_rec( p, (Aig_Obj_t **)vPairs->pArray, vPairs->nSize, AIG_OBJ_AND ) );
}